

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O0

double __thiscall
wasm::ReorderGlobals::computeSize(ReorderGlobals *this,IndexIndexMap *indices,IndexCountMap *counts)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  uint local_4c;
  uint local_48;
  Index i_1;
  Index nextSizeIncrease;
  Index sizeInBits;
  double total;
  ReorderGlobals *pRStack_30;
  Index i;
  double total_1;
  IndexCountMap *counts_local;
  IndexIndexMap *indices_local;
  ReorderGlobals *this_local;
  
  if ((this->always & 1U) == 0) {
    _nextSizeIncrease = (ReorderGlobals *)0x0;
    i_1 = 0;
    local_48 = 0;
    local_4c = 0;
    while( true ) {
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(indices);
      if (sVar1 <= local_4c) break;
      if (local_4c == local_48) {
        i_1 = i_1 + 1;
        local_48 = 1 << ((char)i_1 * '\a' & 0x1fU);
      }
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (indices,(ulong)local_4c);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](counts,(ulong)*pvVar2);
      _nextSizeIncrease = (ReorderGlobals *)(*pvVar3 * (double)i_1 + (double)_nextSizeIncrease);
      local_4c = local_4c + 1;
    }
    this_local = _nextSizeIncrease;
  }
  else {
    pRStack_30 = (ReorderGlobals *)0x0;
    total._4_4_ = 0;
    while( true ) {
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(indices);
      if (sVar1 <= total._4_4_) break;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (indices,(ulong)total._4_4_);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](counts,(ulong)*pvVar2);
      pRStack_30 = (ReorderGlobals *)
                   (*pvVar3 * ((double)total._4_4_ / 128.0 + 1.0) + (double)pRStack_30);
      total._4_4_ = total._4_4_ + 1;
    }
    this_local = pRStack_30;
  }
  return (double)this_local;
}

Assistant:

double computeSize(IndexIndexMap& indices, IndexCountMap& counts) {
    if (always) {
      // In this mode we gradually increase the cost of later globals, in an
      // unrealistic but smooth manner.
      double total = 0;
      for (Index i = 0; i < indices.size(); i++) {
        // Multiply the count for this global by a smoothed LEB factor, which
        // starts at 1 (for 1 byte) at index 0, and then increases linearly with
        // i, so that after 128 globals we reach 2 (which is the true index at
        // which the LEB size normally jumps from 1 to 2), and so forth.
        total += counts[indices[i]] * (1.0 + (i / 128.0));
      }
      return total;
    }

    // The total size we are computing.
    double total = 0;
    // Track the size in bits and the next index at which the size increases. At
    // the first iteration we'll compute the size of the LEB for index 0, and so
    // forth.
    Index sizeInBits = 0;
    Index nextSizeIncrease = 0;
    for (Index i = 0; i < indices.size(); i++) {
      if (i == nextSizeIncrease) {
        sizeInBits++;
        // At the current size we have 7 * sizeInBits bits to use.  For example,
        // at index 0 the size is 1 and we'll compute 128 here, and indeed after
        // emitting 128 globals (0,..,127) the 129th (at index 128) requires a
        // larger LEB.
        nextSizeIncrease = 1 << (7 * sizeInBits);
      }
      total += counts[indices[i]] * sizeInBits;
    }
    return total;
  }